

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetContextActivateMetricGroupsPrologue
          (ZETHandleLifetimeValidation *this,zet_context_handle_t hContext,
          zet_device_handle_t hDevice,uint32_t count,zet_metric_group_handle_t *phMetricGroups)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  ulong uVar4;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hContext);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if ((bVar2) &&
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice), bVar2)) {
    if (count != 0 && phMetricGroups != (zet_metric_group_handle_t *)0x0) {
      uVar4 = 1;
      do {
        bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phMetricGroups[uVar4 - 1]);
        if (!bVar2) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      } while ((phMetricGroups != (zet_metric_group_handle_t *)0x0) &&
              (bVar2 = uVar4 < count, uVar4 = uVar4 + 1, bVar2));
    }
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetContextActivateMetricGroupsPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t count,                                 ///< [in] metric group count to activate; must be 0 if `nullptr ==
                                                        ///< phMetricGroups`
        zet_metric_group_handle_t* phMetricGroups       ///< [in][optional][range(0, count)] handles of the metric groups to activate.
                                                        ///< nullptr deactivates all previously used metric groups.
                                                        ///< all metrics groups must come from a different domains.
                                                        ///< metric query and metric stream must use activated metric groups.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phMetricGroups) && (i < count); ++i){
            if (!context.handleLifetime->isHandleValid( phMetricGroups[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }